

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_cancellation_impl.cc
# Opt level: O0

int16_t webrtc::anon_unknown_0::MapSetting(SuppressionLevel level)

{
  int16_t local_a;
  SuppressionLevel level_local;
  
  if (level == kLowSuppression) {
    local_a = 0;
  }
  else if (level == kModerateSuppression) {
    local_a = 1;
  }
  else {
    if (level != kHighSuppression) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/echo_cancellation_impl.cc"
                    ,0x20,
                    "int16_t webrtc::(anonymous namespace)::MapSetting(EchoCancellation::SuppressionLevel)"
                   );
    }
    local_a = 2;
  }
  return local_a;
}

Assistant:

int16_t MapSetting(EchoCancellation::SuppressionLevel level) {
  switch (level) {
    case EchoCancellation::kLowSuppression:
      return kAecNlpConservative;
    case EchoCancellation::kModerateSuppression:
      return kAecNlpModerate;
    case EchoCancellation::kHighSuppression:
      return kAecNlpAggressive;
  }
  assert(false);
  return -1;
}